

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRExpression * __thiscall
spirv_cross::Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int_const&,bool>
          (Compiler *this,uint32_t id,char (*args) [1],uint *args_1,bool *args_2)

{
  SPIRExpression *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeExpression,(ID)id);
  pSVar1 = variant_set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int_const&,bool>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id,args,args_1,
                      args_2);
  (pSVar1->super_IVariant).self.id = id;
  pSVar1->emitted_loop_level = this->current_loop_level;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}